

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

int smf_seek_to_seconds(smf_t *smf,double seconds)

{
  smf_event_t *psVar1;
  int iVar2;
  
  if (seconds < 0.0) {
    __assert_fail("seconds >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x3c5,"int smf_seek_to_seconds(smf_t *, double)");
  }
  iVar2 = 0;
  if ((smf->last_seek_position != seconds) || (NAN(smf->last_seek_position) || NAN(seconds))) {
    smf_rewind(smf);
    while (psVar1 = smf_peek_next_event(smf), psVar1 != (smf_event_t *)0x0) {
      if (seconds < psVar1->time_seconds || seconds == psVar1->time_seconds) {
        smf->last_seek_position = seconds;
        return 0;
      }
      smf_get_next_event(smf);
    }
    g_log("libsmf",8,"Trying to seek past the end of song.");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
smf_seek_to_seconds(smf_t *smf, double seconds)
{
	smf_event_t *event;

	assert(seconds >= 0.0);

	if (seconds == smf->last_seek_position) {
#if 0
		g_debug("Avoiding seek to %f seconds.", seconds);
#endif
		return (0);
	}

	smf_rewind(smf);

#if 0
	g_debug("Seeking to %f seconds.", seconds);
#endif

	for (;;) {
		event = smf_peek_next_event(smf);

		if (event == NULL) {
			g_critical("Trying to seek past the end of song.");
			return (-1);
		}

		if (event->time_seconds < seconds)
			smf_skip_next_event(smf);
		else
			break;
	}

	smf->last_seek_position = seconds;

	return (0);
}